

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTests.cpp
# Opt level: O0

void testDealloc(void *ptr)

{
  uint local_30;
  bool local_29;
  uint i;
  bool *local_20;
  bool *local_18;
  bool *active;
  void *ptr_local;
  
  if (ptr != (void *)0x0) {
    local_20 = (bool *)((long)ptr + -0x80);
    active = local_20;
    local_18 = SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::find
                         (&activePoiners,(unsigned_long *)&local_20);
    if ((local_18 == (bool *)0x0) || ((*local_18 & 1U) == 0)) {
      printf("pointer was not allocated (%p)\n",active);
      abort();
    }
    _i = active;
    local_29 = false;
    SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::insert
              (&activePoiners,(unsigned_long *)&i,&local_29);
    testTotalMemoryFree = testTotalMemoryFree + 1;
    testTotalMemoryUsed = testTotalMemoryUsed - *(int *)active;
    for (local_30 = 4; local_30 < 0x80; local_30 = local_30 + 1) {
      if (active[local_30] != true) {
        __assert_fail("((unsigned char*)ptr)[i] == 0xee",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/UnitTests.cpp"
                      ,0x89,"void testDealloc(void *)");
      }
    }
    if (active != (bool *)0x0) {
      operator_delete__(active);
    }
  }
  return;
}

Assistant:

void testDealloc(void* ptr)
{
	if(!ptr)
		return;

	ptr = (char*)ptr - 128;

	bool* active = activePoiners.find(uintptr_t(ptr));

	if(!active || !*active)
	{
		printf("pointer was not allocated (%p)\n", ptr);
		abort();
	}

	activePoiners.insert(uintptr_t(ptr), 0);

	testTotalMemoryFree++;
	testTotalMemoryUsed -= *(unsigned*)ptr;

	for(unsigned i = sizeof(unsigned); i < 128; i++)
		assert(((unsigned char*)ptr)[i] == 0xee);

#ifdef ALLOC_TOP_DOWN
	VirtualFree((char*)ptr, 0, MEM_RELEASE);
#else
	delete[] (char*)ptr;
#endif
}